

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_constructor_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp in_R8;
  sexp_proc1 unaff_retaddr;
  sexp_uint_t type_size;
  sexp in_stack_ffffffffffffff98;
  sexp_uint_t in_stack_ffffffffffffffa0;
  sexp in_stack_ffffffffffffffa8;
  sexp in_stack_ffffffffffffffb0;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_R8 & 3) == 0) && (in_R8->tag == 1)) {
    in_R8 = (sexp)((ulong)(in_R8->value).type.tag << 1 | 1);
  }
  if (((ulong)in_R8 & 1) == 1) {
    auVar1._8_8_ = (long)in_R8 >> 0x3f;
    auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
    psVar2 = sexp_make_opcode((sexp)0x0,
                              (sexp)((long)*(short *)(*(long *)((long)&((((in_RDI->value).type.
                                                                         setters)->value).type.
                                                                       getters)->value +
                                                               SUB168(auVar1 / SEXT816(2),0) * 8 + 8
                                                               ) + 0x5e) << 1 | 1),in_R8,
                              (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)&DAT_00000001,in_R8,
                              in_RCX,in_RDX,in_RSI,in_RDI,in_stack_fffffffffffffff8,unaff_retaddr);
  }
  else {
    psVar2 = sexp_type_exception(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return psVar2;
}

Assistant:

sexp sexp_make_constructor_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type) {
  sexp_uint_t type_size;
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, type);
  type_size = sexp_type_size_base(sexp_type_by_index(ctx, sexp_unbox_fixnum(type)));
  return sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_CONSTRUCTOR),
                          sexp_make_fixnum(SEXP_OP_MAKE), SEXP_ZERO, SEXP_ZERO,
                          SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, type,
                          sexp_make_fixnum(type_size), NULL);
}